

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit units::checkUnitAddition(string *unit_string,uint64_t match_flags)

{
  pointer pcVar1;
  unit_data uVar2;
  size_t __n;
  precise_unit *extraout_RDX;
  precise_unit *extraout_RDX_00;
  precise_unit *result;
  precise_unit *extraout_RDX_01;
  precise_unit *extraout_RDX_02;
  ulong uVar3;
  double dVar4;
  precise_unit pVar5;
  precise_unit local_f0;
  precise_unit local_e0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"+","");
  __n = findOperatorSep(unit_string,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  uVar3 = 0xfa94a488;
  dVar4 = NAN;
  if (0xfffffffffffffffd < __n - 1) goto LAB_00400a46;
  pcVar1 = (unit_string->_M_dataplus)._M_p;
  if ((((pcVar1[__n - 1] == 0x2b) || (__n == unit_string->_M_string_length - 1)) ||
      (pcVar1[__n + 1] == '+')) ||
     ((((byte)(pcVar1[__n - 1] | 0x20U) == 0x65 && (1 < __n && (byte)(pcVar1[__n + 1] - 0x30U) < 10)
       ) && ((byte)(pcVar1[__n - 2] - 0x30U) < 10)))) goto LAB_00400a46;
  local_f0 = (precise_unit)ZEXT816(0x3ff0000000000000);
  local_e0 = (precise_unit)ZEXT816(0x3ff0000000000000);
  if (__n < unit_string->_M_string_length >> 1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0,
               __n);
    local_f0 = unit_from_string_internal((string *)&local_90,match_flags);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((!NAN(local_f0.multiplier_)) || (local_f0.base_units_ != (unit_data)0xfa94a488)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 __n + 1,0xffffffffffffffff);
      local_e0 = unit_from_string_internal((string *)&local_b0,match_flags);
      result = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        result = extraout_RDX_00;
      }
      if (NAN(local_e0.multiplier_)) {
        uVar2 = local_e0.base_units_;
joined_r0x00400a0b:
        if (uVar2 == (unit_data)0xfa94a488) goto LAB_00400a0d;
      }
LAB_00400a17:
      dVar4 = convert<units::precise_unit,units::precise_unit>
                        ((units *)&local_e0,1.0,&local_f0,result);
      if (!NAN(dVar4)) {
        dVar4 = dVar4 * local_f0.multiplier_ + local_f0.multiplier_;
        uVar3 = (ulong)(uint)local_f0.base_units_;
        goto LAB_00400a46;
      }
    }
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
               __n + 1,0xffffffffffffffff);
    local_e0 = unit_from_string_internal((string *)&local_50,match_flags);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((!NAN(local_e0.multiplier_)) || (local_e0.base_units_ != (unit_data)0xfa94a488)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0,
                 __n);
      local_f0 = unit_from_string_internal((string *)&local_70,match_flags);
      result = extraout_RDX_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        result = extraout_RDX_02;
      }
      if (NAN(local_f0.multiplier_)) {
        uVar2 = local_f0.base_units_;
        goto joined_r0x00400a0b;
      }
      goto LAB_00400a17;
    }
  }
LAB_00400a0d:
  dVar4 = NAN;
LAB_00400a46:
  pVar5.base_units_ = (unit_data)(int)uVar3;
  pVar5.commodity_ = (int)(uVar3 >> 0x20);
  pVar5.multiplier_ = dVar4;
  return pVar5;
}

Assistant:

static precise_unit
    checkUnitAddition(const std::string& unit_string, std::uint64_t match_flags)
{
    auto sep = findOperatorSep(unit_string, "+");
    if (sep != std::string::npos && sep > 0) {
        if ((unit_string[sep - 1] == '+') || sep == unit_string.size() - 1 ||
            unit_string[sep + 1] == '+') {
            return precise::invalid;
        }
        if (unit_string[sep - 1] == 'e' || unit_string[sep - 1] == 'E') {
            // this is scientific notation not addition
            if (isDigitCharacter(unit_string[sep + 1]) &&
                (sep > 1 && isDigitCharacter(unit_string[sep - 2]))) {
                return precise::invalid;
            }
        }
        precise_unit a_unit;
        precise_unit b_unit;
        if (sep + 1 > unit_string.size() / 2) {
            b_unit = unit_from_string_internal(
                unit_string.substr(sep + 1), match_flags);
            if (!is_valid(b_unit)) {
                return precise::invalid;
            }
            a_unit = unit_from_string_internal(
                unit_string.substr(0, sep), match_flags);

            if (!is_valid(a_unit)) {
                return precise::invalid;
            }
        } else {
            a_unit = unit_from_string_internal(
                unit_string.substr(0, sep), match_flags);

            if (!is_valid(a_unit)) {
                return precise::invalid;
            }
            b_unit = unit_from_string_internal(
                unit_string.substr(sep + 1), match_flags);
            if (!is_valid(b_unit)) {
                return precise::invalid;
            }
        }
        auto res = convert(b_unit, a_unit);
        if (!std::isnan(res)) {
            return {
                a_unit.multiplier() + a_unit.multiplier() * res,
                a_unit.base_units()};
        }
    }
    return precise::invalid;
}